

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calibrateAccel.cpp
# Opt level: O1

bool __thiscall CalibrateAccel::CalculateMean(CalibrateAccel *this,Vector3d *Mean)

{
  Vector3d *pVVar1;
  pointer pMVar2;
  pointer pMVar3;
  long lVar4;
  ActualDstType actualDst;
  long lVar5;
  pointer pMVar6;
  double dVar7;
  double dVar9;
  undefined1 auVar8 [16];
  double dVar10;
  undefined1 auVar11 [16];
  
  lVar4 = 0;
  do {
    pVVar1 = Mean + lVar4;
    Mean[lVar4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [0] = 0.0;
    Mean[lVar4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [1] = 0.0;
    Mean[lVar4].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = 0.0;
    pMVar2 = this->Accel[lVar4].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pMVar3 = this->Accel[lVar4].
             super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pMVar2 != pMVar3) {
      dVar7 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[0];
      dVar9 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
              m_data.array[1];
      dVar10 = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
               m_data.array[2];
      pMVar6 = pMVar2;
      do {
        dVar7 = dVar7 + (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[0];
        dVar9 = dVar9 + (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                        m_storage.m_data.array[1];
        dVar10 = dVar10 + (pMVar6->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                          m_storage.m_data.array[2];
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[0] = dVar7;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[1] = dVar9;
        (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
        array[2] = dVar10;
        pMVar6 = pMVar6 + 1;
      } while (pMVar6 != pMVar3);
    }
    lVar5 = ((long)pMVar3 - (long)pMVar2 >> 3) * -0x5555555555555555;
    auVar11._8_4_ = (int)((ulong)lVar5 >> 0x20);
    auVar11._0_8_ = lVar5;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (auVar11._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0);
    auVar8._8_8_ = dVar10;
    auVar8._0_8_ = dVar10;
    auVar11 = divpd(*(undefined1 (*) [16])
                     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                     m_storage.m_data.array,auVar8);
    *(undefined1 (*) [16])
     (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array =
         auVar11;
    (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.array[2]
         = (pVVar1->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
           array[2] / dVar10;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 6);
  return true;
}

Assistant:

bool CalibrateAccel::CalculateMean(Vector3d* Mean)
{
    for(int i = 0; i < 6; ++i)
    {
        try
        {
            Mean[i] = Vector3d::Zero();
            for(auto data : this->Accel[i])
            {
                Mean[i][0] += data[0];
                Mean[i][1] += data[1];
                Mean[i][2] += data[2];
            }
            Mean[i] /= Accel[i].size();
        }
        catch(const std::exception& e)
        {
            std::cerr << e.what() << '\n';
            return false;
        }
    }

    return true;
}